

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O2

void * tc_realloc(void *__ptr,size_t __size)

{
  int iVar1;
  MallocBlock *this;
  MallocBlock *this_00;
  size_t sVar2;
  int *piVar3;
  size_t *p;
  SpinLockHolder local_30;
  SpinLockHolder l;
  
  if (__ptr == (void *)0x0) {
    p = (size_t *)do_debug_malloc_or_debug_cpp_alloc(__size);
    tcmalloc::InvokeNewHook(p,__size);
  }
  else if (__size == 0) {
    tcmalloc::InvokeDeleteHook(__ptr);
    p = (size_t *)0x0;
    DebugDeallocate(__ptr,-0x10325470,0);
  }
  else {
    this = MallocBlock::FromRawPointer(__ptr);
    MallocBlock::Check(this,-0x10325470);
    this_00 = MallocBlock::Allocate(__size,-0x10325470);
    if (this_00 == (MallocBlock *)0x0) {
      p = (size_t *)0x0;
    }
    else {
      sVar2 = MallocBlock::actual_data_size(this,__ptr);
      p = this_00->size_and_magic2_;
      if (__size <= sVar2) {
        sVar2 = __size;
      }
      memcpy(p,__ptr,sVar2);
      tcmalloc::InvokeDeleteHook(__ptr);
      tcmalloc::InvokeNewHook(p,__size);
      DebugDeallocate(__ptr,-0x10325470,0);
      if (FLAG__namespace_do_not_use_directly_use_DECLARE_bool_instead::FLAGS_malloctrace == '\x01')
      {
        local_30.lock_ = &malloc_trace_lock;
        SpinLock::Lock(&malloc_trace_lock);
        iVar1 = TraceFd();
        sVar2 = MallocBlock::actual_data_size(this_00,p);
        piVar3 = __errno_location();
        TracePrintf(iVar1,"%s\t%zu\t%p\t%zu","realloc",sVar2,p,piVar3);
        iVar1 = TraceFd();
        TracePrintf(iVar1,"\n");
        SpinLockHolder::~SpinLockHolder(&local_30);
      }
    }
  }
  return p;
}

Assistant:

PERFTOOLS_DLL_DECL void* tc_realloc(void* ptr, size_t size) PERFTOOLS_NOTHROW {
  if (ptr == nullptr) {
    ptr = do_debug_malloc_or_debug_cpp_alloc(size);
    tcmalloc::InvokeNewHook(ptr, size);
    return ptr;
  }
  if (size == 0) {
    tcmalloc::InvokeDeleteHook(ptr);
    DebugDeallocate(ptr, MallocBlock::kMallocType, 0);
    return nullptr;
  }

  if (PREDICT_FALSE(tcmalloc::IsEmergencyPtr(ptr))) {
    return tcmalloc::EmergencyRealloc(ptr, size);
  }

  MallocBlock* old = MallocBlock::FromRawPointer(ptr);
  old->Check(MallocBlock::kMallocType);
  MallocBlock* p = MallocBlock::Allocate(size, MallocBlock::kMallocType);

  // If realloc fails we are to leave the old block untouched and
  // return null
  if (p == nullptr)  return nullptr;

  size_t old_size = old->actual_data_size(ptr);

  memcpy(p->data_addr(), ptr, (old_size < size) ? old_size : size);
  tcmalloc::InvokeDeleteHook(ptr);
  tcmalloc::InvokeNewHook(p->data_addr(), size);
  DebugDeallocate(ptr, MallocBlock::kMallocType, 0);
  MALLOC_TRACE("realloc", p->actual_data_size(p->data_addr()), p->data_addr());
  return p->data_addr();
}